

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

string * __thiscall Database::Escape(string *__return_storage_ptr__,Database *this,string *raw)

{
  impl_ iVar1;
  bool bVar2;
  long lVar3;
  void *pvVar4;
  anon_union_8_2_1ccce1b9_for_impl__0 *paVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  reference pcVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  iterator it;
  unsigned_long esclen;
  char *escret;
  string *raw_local;
  Database *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (this->engine == MySQL) {
    lVar3 = std::__cxx11::string::length();
    pvVar4 = operator_new__(lVar3 * 2 + 1);
    paVar5 = &std::unique_ptr<Database::impl_,_std::default_delete<Database::impl_>_>::operator->
                        (&this->impl)->field_0;
    iVar1.field_0 = (anon_union_8_2_1ccce1b9_for_impl__0)paVar5->mysql_handle;
    uVar7 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::length();
    mysql_real_escape_string(iVar1.field_0,pvVar4,uVar7,uVar6);
    std::__cxx11::string::assign((char *)__return_storage_ptr__,(ulong)pvVar4);
    if (pvVar4 != (void *)0x0) {
      operator_delete__(pvVar4);
    }
  }
  else if (this->engine == SQLite) {
    uVar7 = std::__cxx11::string::c_str();
    pcVar8 = (char *)sqlite3_mprintf("%q",uVar7);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar8);
    sqlite3_free(pcVar8);
  }
  local_50._M_current = (char *)std::__cxx11::string::begin();
  while( true ) {
    local_58._M_current = (char *)std::__cxx11::string::end();
    bVar2 = __gnu_cxx::operator!=(&local_50,&local_58);
    if (!bVar2) break;
    pcVar9 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_50);
    if (((*pcVar9 == '@') ||
        (pcVar9 = __gnu_cxx::
                  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_50), *pcVar9 == '#')) ||
       (pcVar9 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_50), *pcVar9 == '$')) {
      pcVar9 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_50);
      *pcVar9 = '?';
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Database::Escape(const std::string& raw)
{
	char *escret;
	unsigned long esclen;
	std::string result;

	switch (this->engine)
	{
#ifdef DATABASE_MYSQL
		case MySQL:
			escret = new char[raw.length()*2+1];
			esclen = mysql_real_escape_string(this->impl->mysql_handle, escret, raw.c_str(), raw.length());
			result.assign(escret, esclen);
			delete[] escret;
			break;
#endif // DATABASE_MYSQL

#ifdef DATABASE_SQLITE
		case SQLite:
			escret = sqlite3_mprintf("%q", raw.c_str());
			result = escret;
			sqlite3_free(escret);
			break;
#endif // DATABASE_SQLITE
	}

	for (std::string::iterator it = result.begin(); it != result.end(); ++it)
	{
		if (*it == '@' || *it == '#' || *it == '$')
		{
			*it = '?';
		}
	}

	return result;
}